

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int handleDeferredMoveto(VdbeCursor *p)

{
  int local_1c;
  int rc;
  int res;
  VdbeCursor *p_local;
  
  _rc = p;
  p_local._4_4_ =
       sqlite3BtreeMovetoUnpacked((p->uc).pCursor,(UnpackedRecord *)0x0,p->movetoTarget,0,&local_1c)
  ;
  if (p_local._4_4_ == 0) {
    if (local_1c == 0) {
      _rc->deferredMoveto = '\0';
      _rc->cacheStatus = 0;
      p_local._4_4_ = 0;
    }
    else {
      p_local._4_4_ = sqlite3CorruptError(0x1370a);
    }
  }
  return p_local._4_4_;
}

Assistant:

static int SQLITE_NOINLINE handleDeferredMoveto(VdbeCursor *p){
  int res, rc;
#ifdef SQLITE_TEST
  extern int sqlite3_search_count;
#endif
  assert( p->deferredMoveto );
  assert( p->isTable );
  assert( p->eCurType==CURTYPE_BTREE );
  rc = sqlite3BtreeMovetoUnpacked(p->uc.pCursor, 0, p->movetoTarget, 0, &res);
  if( rc ) return rc;
  if( res!=0 ) return SQLITE_CORRUPT_BKPT;
#ifdef SQLITE_TEST
  sqlite3_search_count++;
#endif
  p->deferredMoveto = 0;
  p->cacheStatus = CACHE_STALE;
  return SQLITE_OK;
}